

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.c
# Opt level: O3

void read_calendar_record
               (calendar_record_t *record,int field_count,char **field_names,char **field_values)

{
  char cVar1;
  int iVar2;
  service_availability_t sVar3;
  ulong uVar4;
  char *pcVar5;
  calendar_record_t *__dest;
  
  record->service_id[0] = '\0';
  record->start_date[0] = '\0';
  record->end_date[0] = '\0';
  record->monday = SA_NOT_SET;
  record->tuesday = SA_NOT_SET;
  record->wednesday = SA_NOT_SET;
  record->thursday = SA_NOT_SET;
  record->friday = SA_NOT_SET;
  record->saturday = SA_NOT_SET;
  record->sunday = SA_NOT_SET;
  if (0 < field_count) {
    uVar4 = 0;
    do {
      pcVar5 = field_names[uVar4];
      iVar2 = strcmp(pcVar5,"service_id");
      if (iVar2 == 0) {
        pcVar5 = field_values[uVar4];
        __dest = record;
LAB_0011963e:
        strcpy(__dest->service_id,pcVar5);
      }
      else {
        iVar2 = strcmp(pcVar5,"start_date");
        if (iVar2 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (calendar_record_t *)record->start_date;
          goto LAB_0011963e;
        }
        iVar2 = strcmp(pcVar5,"end_date");
        if (iVar2 == 0) {
          pcVar5 = field_values[uVar4];
          __dest = (calendar_record_t *)record->end_date;
          goto LAB_0011963e;
        }
        iVar2 = strcmp(pcVar5,"monday");
        if (iVar2 == 0) {
          cVar1 = *field_values[uVar4];
          if (cVar1 == '0') {
            sVar3 = SA_UNAVAILABLE;
LAB_001196ad:
            if (field_values[uVar4][1] != '\0') {
              sVar3 = SA_NOT_SET;
            }
          }
          else {
            sVar3 = SA_NOT_SET;
            if (cVar1 == '1') {
              sVar3 = SA_AVAILABLE;
              goto LAB_001196ad;
            }
          }
          record->monday = sVar3;
        }
        else {
          iVar2 = strcmp(pcVar5,"tuesday");
          if (iVar2 == 0) {
            cVar1 = *field_values[uVar4];
            if (cVar1 == '0') {
              sVar3 = SA_UNAVAILABLE;
LAB_001196de:
              if (field_values[uVar4][1] != '\0') {
                sVar3 = SA_NOT_SET;
              }
            }
            else {
              sVar3 = SA_NOT_SET;
              if (cVar1 == '1') {
                sVar3 = SA_AVAILABLE;
                goto LAB_001196de;
              }
            }
            record->tuesday = sVar3;
          }
          else {
            iVar2 = strcmp(pcVar5,"wednesday");
            if (iVar2 == 0) {
              cVar1 = *field_values[uVar4];
              if (cVar1 == '0') {
                sVar3 = SA_UNAVAILABLE;
LAB_00119712:
                if (field_values[uVar4][1] != '\0') {
                  sVar3 = SA_NOT_SET;
                }
              }
              else {
                sVar3 = SA_NOT_SET;
                if (cVar1 == '1') {
                  sVar3 = SA_AVAILABLE;
                  goto LAB_00119712;
                }
              }
              record->wednesday = sVar3;
            }
            else {
              iVar2 = strcmp(pcVar5,"thursday");
              if (iVar2 == 0) {
                cVar1 = *field_values[uVar4];
                if (cVar1 == '0') {
                  sVar3 = SA_UNAVAILABLE;
LAB_00119746:
                  if (field_values[uVar4][1] != '\0') {
                    sVar3 = SA_NOT_SET;
                  }
                }
                else {
                  sVar3 = SA_NOT_SET;
                  if (cVar1 == '1') {
                    sVar3 = SA_AVAILABLE;
                    goto LAB_00119746;
                  }
                }
                record->thursday = sVar3;
              }
              else {
                iVar2 = strcmp(pcVar5,"friday");
                if (iVar2 == 0) {
                  cVar1 = *field_values[uVar4];
                  if (cVar1 == '0') {
                    sVar3 = SA_UNAVAILABLE;
LAB_0011975d:
                    if (field_values[uVar4][1] != '\0') {
                      sVar3 = SA_NOT_SET;
                    }
                  }
                  else {
                    sVar3 = SA_NOT_SET;
                    if (cVar1 == '1') {
                      sVar3 = SA_AVAILABLE;
                      goto LAB_0011975d;
                    }
                  }
                  record->friday = sVar3;
                }
                else {
                  iVar2 = strcmp(pcVar5,"saturday");
                  if (iVar2 == 0) {
                    cVar1 = *field_values[uVar4];
                    if (cVar1 == '0') {
                      sVar3 = SA_UNAVAILABLE;
LAB_00119774:
                      if (field_values[uVar4][1] != '\0') {
                        sVar3 = SA_NOT_SET;
                      }
                    }
                    else {
                      sVar3 = SA_NOT_SET;
                      if (cVar1 == '1') {
                        sVar3 = SA_AVAILABLE;
                        goto LAB_00119774;
                      }
                    }
                    record->saturday = sVar3;
                  }
                  else {
                    iVar2 = strcmp(pcVar5,"sunday");
                    if (iVar2 == 0) {
                      cVar1 = *field_values[uVar4];
                      if (cVar1 == '0') {
                        sVar3 = SA_UNAVAILABLE;
LAB_0011978b:
                        if (field_values[uVar4][1] != '\0') {
                          sVar3 = SA_NOT_SET;
                        }
                      }
                      else {
                        sVar3 = SA_NOT_SET;
                        if (cVar1 == '1') {
                          sVar3 = SA_AVAILABLE;
                          goto LAB_0011978b;
                        }
                      }
                      record->sunday = sVar3;
                    }
                  }
                }
              }
            }
          }
        }
      }
      uVar4 = uVar4 + 1;
    } while ((uint)field_count != uVar4);
  }
  return;
}

Assistant:

void read_calendar_record(calendar_record_t *record, int field_count, const char **field_names, const char **field_values) {
    init_calendar_record(record);

    for (int i = 0; i < field_count; i++) {
        if (strcmp(field_names[i], "service_id") == 0) {
            strcpy(record->service_id, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "start_date") == 0) {
            strcpy(record->start_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "end_date") == 0) {
            strcpy(record->end_date, field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "monday") == 0) {
            record->monday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "tuesday") == 0) {
            record->tuesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "wednesday") == 0) {
            record->wednesday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "thursday") == 0) {
            record->thursday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "friday") == 0) {
            record->friday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "saturday") == 0) {
            record->saturday = parse_service_availability(field_values[i]);
            continue;
        }
        if (strcmp(field_names[i], "sunday") == 0) {
            record->sunday = parse_service_availability(field_values[i]);
            continue;
        }
    }
}